

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  int *piVar20;
  double *pdVar21;
  double *pdVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  double *pdVar30;
  double *pdVar31;
  int k;
  long lVar32;
  int j;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double sumOverJD1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  pdVar15 = this->gPartials[parIndex];
  pdVar16 = this->gStateFrequencies[stateFrequenciesIndex];
  pdVar17 = this->gTransitionMatrices[probIndex];
  pdVar18 = this->gTransitionMatrices[firstDerivativeIndex];
  pdVar19 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar20 = this->gTipStates[childIndex], piVar20 != (int *)0x0)) {
    uVar10 = this->kPatternCount;
    uVar11 = this->kCategoryCount;
    lVar29 = 0;
    for (uVar28 = 0; uVar28 != (~((int)uVar11 >> 0x1f) & uVar11); uVar28 = uVar28 + 1) {
      uVar12 = this->kStateCount;
      iVar13 = this->kPartialsPaddedStateCount;
      lVar29 = (long)(int)lVar29;
      lVar32 = 0;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = pdVar19[uVar28];
      pdVar30 = pdVar15 + lVar29;
      iVar14 = this->kMatrixSize;
      for (uVar26 = 0; uVar26 != (~((int)uVar10 >> 0x1f) & uVar10); uVar26 = uVar26 + 1) {
        lVar32 = (long)(int)lVar32;
        pdVar31 = this->integrationTmp;
        iVar24 = this->kTransPaddedStateCount;
        pdVar21 = this->firstDerivTmp;
        lVar25 = (long)piVar20[uVar26] + (long)(iVar14 * (int)uVar28);
        for (uVar27 = 0; (~((int)uVar12 >> 0x1f) & uVar12) != uVar27; uVar27 = uVar27 + 1) {
          auVar45._8_8_ = 0;
          auVar45._0_8_ = pdVar31[lVar32 + uVar27];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = pdVar17[lVar25] * pdVar30[uVar27];
          auVar45 = vfmadd213sd_fma(auVar38,auVar34,auVar45);
          pdVar31[lVar32 + uVar27] = auVar45._0_8_;
          pdVar22 = pdVar18 + lVar25;
          lVar25 = lVar25 + iVar24;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar21[lVar32 + uVar27];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *pdVar22 * pdVar30[uVar27];
          auVar45 = vfmadd213sd_fma(auVar39,auVar34,auVar1);
          pdVar21[lVar32 + uVar27] = auVar45._0_8_;
        }
        lVar29 = lVar29 + iVar13;
        pdVar30 = pdVar30 + iVar13;
        lVar32 = lVar32 + uVar27;
      }
    }
  }
  else {
    lVar29 = 0;
    pdVar30 = this->gPartials[childIndex];
    uVar10 = this->kCategoryCount;
    uVar11 = this->kPatternCount;
    for (uVar28 = 0; uVar28 != (~((int)uVar10 >> 0x1f) & uVar10); uVar28 = uVar28 + 1) {
      uVar12 = this->kStateCount;
      iVar13 = this->kPartialsPaddedStateCount;
      lVar29 = (long)(int)lVar29;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = pdVar19[uVar28];
      pdVar31 = pdVar30 + lVar29;
      lVar32 = 0;
      iVar14 = this->kMatrixSize;
      for (uVar23 = 0; uVar23 != (~((int)uVar11 >> 0x1f) & uVar11); uVar23 = uVar23 + 1) {
        pdVar21 = this->integrationTmp;
        pdVar22 = this->firstDerivTmp;
        lVar32 = (long)(int)lVar32;
        uVar26 = 0;
        iVar24 = iVar14 * (int)uVar28;
        while (uVar26 != (~((int)uVar12 >> 0x1f) & uVar12)) {
          auVar34 = ZEXT816(0) << 0x40;
          auVar45 = ZEXT816(0) << 0x40;
          for (uVar27 = 0; uVar12 != uVar27; uVar27 = uVar27 + 1) {
            auVar46._8_8_ = 0;
            auVar46._0_8_ = pdVar31[uVar27];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = pdVar17[(long)iVar24 + uVar27];
            auVar34 = vfmadd231sd_fma(auVar34,auVar46,auVar2);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar18[(long)iVar24 + uVar27];
            auVar45 = vfmadd231sd_fma(auVar45,auVar46,auVar3);
          }
          iVar24 = iVar24 + uVar12 + 1;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = pdVar21[lVar32];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = auVar34._0_8_ * pdVar15[lVar29 + uVar26];
          auVar34 = vfmadd213sd_fma(auVar40,auVar35,auVar4);
          pdVar21[lVar32] = auVar34._0_8_;
          lVar25 = lVar29 + uVar26;
          uVar26 = uVar26 + 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pdVar22[lVar32];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = auVar45._0_8_ * pdVar15[lVar25];
          auVar34 = vfmadd213sd_fma(auVar41,auVar35,auVar5);
          pdVar22[lVar32] = auVar34._0_8_;
          lVar32 = lVar32 + 1;
        }
        pdVar31 = pdVar31 + iVar13;
        lVar29 = lVar29 + iVar13;
      }
    }
  }
  lVar29 = 0;
  for (lVar32 = 0; uVar10 = this->kPatternCount, lVar32 < (int)uVar10; lVar32 = lVar32 + 1) {
    lVar29 = (long)(int)lVar29;
    auVar34 = ZEXT816(0) << 0x40;
    auVar45 = ZEXT816(0) << 0x40;
    uVar28 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
    for (uVar26 = 0; uVar28 != uVar26; uVar26 = uVar26 + 1) {
      auVar42._8_8_ = 0;
      auVar42._0_8_ = pdVar16[uVar26];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = this->integrationTmp[lVar29 + uVar26];
      auVar34 = vfmadd231sd_fma(auVar34,auVar42,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = this->firstDerivTmp[lVar29 + uVar26];
      auVar45 = vfmadd231sd_fma(auVar45,auVar42,auVar7);
    }
    lVar29 = lVar29 + uVar28;
    dVar33 = log(auVar34._0_8_);
    this->outLogLikelihoodsTmp[lVar32] = dVar33;
    this->outFirstDerivativesTmp[lVar32] = auVar45._0_8_ / auVar34._0_8_;
  }
  if (scalingFactorsIndex == -1) {
    uVar28 = (ulong)(~((int)uVar10 >> 0x1f) & uVar10);
  }
  else {
    pdVar15 = this->outLogLikelihoodsTmp;
    pdVar16 = this->gScaleBuffers[scalingFactorsIndex];
    uVar28 = (ulong)(~((int)uVar10 >> 0x1f) & uVar10);
    for (uVar26 = 0; uVar28 != uVar26; uVar26 = uVar26 + 1) {
      pdVar15[uVar26] = pdVar16[uVar26] + pdVar15[uVar26];
    }
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  uVar26 = 0;
  pdVar15 = this->gPatternWeights;
  pdVar16 = this->outLogLikelihoodsTmp;
  pdVar17 = this->outFirstDerivativesTmp;
  while (uVar28 != uVar26) {
    auVar36._8_8_ = 0;
    auVar36._0_8_ = pdVar16[uVar26];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = pdVar15[uVar26];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *outSumLogLikelihood;
    auVar34 = vfmadd213sd_fma(auVar43,auVar36,auVar8);
    *outSumLogLikelihood = auVar34._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = pdVar17[uVar26];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = pdVar15[uVar26];
    uVar26 = uVar26 + 1;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *outSumFirstDerivative;
    auVar34 = vfmadd213sd_fma(auVar44,auVar37,auVar9);
    *outSumFirstDerivative = auVar34._0_8_;
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}